

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

void icetGetFloatv(IceTEnum pname,IceTFloat *params)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  IceTState pIVar4;
  long lVar5;
  IceTEnum type;
  char msg [256];
  char acStack_118 [264];
  
  uVar3 = (ulong)pname;
  pIVar4 = icetGetState();
  switch(pIVar4[uVar3].type) {
  case 0x8000:
    iVar1 = pIVar4[uVar3].num_entries;
    if (0 < (long)iVar1) {
      pvVar2 = pIVar4[uVar3].data;
      lVar5 = 0;
      do {
        params[lVar5] = (IceTFloat)(float)*(byte *)((long)pvVar2 + lVar5);
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    break;
  case 0x8001:
  case 0x8002:
switchD_0010a6ba_caseD_8001:
    sprintf(acStack_118,"Could not cast value for 0x%x.",uVar3);
    type = 0xfffffffd;
    goto LAB_0010a73c;
  case 0x8003:
    iVar1 = pIVar4[uVar3].num_entries;
    if (0 < (long)iVar1) {
      pvVar2 = pIVar4[uVar3].data;
      lVar5 = 0;
      do {
        params[lVar5] = (IceTFloat)(float)*(int *)((long)pvVar2 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    break;
  case 0x8004:
    iVar1 = pIVar4[uVar3].num_entries;
    if (0 < (long)iVar1) {
      pvVar2 = pIVar4[uVar3].data;
      lVar5 = 0;
      do {
        params[lVar5] = *(IceTFloat *)((long)pvVar2 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    break;
  case 0x8005:
    iVar1 = pIVar4[uVar3].num_entries;
    if (0 < (long)iVar1) {
      pvVar2 = pIVar4[uVar3].data;
      lVar5 = 0;
      do {
        params[lVar5] = (IceTFloat)(float)*(double *)((long)pvVar2 + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    break;
  default:
    if (pIVar4[uVar3].type != 0) goto switchD_0010a6ba_caseD_8001;
    sprintf(acStack_118,"No such parameter, 0x%x.",uVar3);
    type = 0xfffffffe;
LAB_0010a73c:
    icetRaiseDiagnostic(acStack_118,type,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0x150);
  }
  return;
}

Assistant:

void icetGetFloatv(IceTEnum pname, IceTFloat *params)
{
    struct IceTStateValue *value = icetGetState() + pname;
    int i;
    stateCheck(pname, icetGetState());
    copyArray(IceTFloat, params, value->type, value->data, value->num_entries);
}